

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9Semi(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  Cec_ParSmf_t Pars;
  
  Cec_ManSmfSetDefaultParams(&Pars);
  Extra_UtilGetoptReset();
LAB_0024a42f:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"WRFSMCTmdvh");
    iVar3 = globalUtilOptind;
    switch(iVar1) {
    case 0x4d:
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-M\" should be followed by an integer.\n";
LAB_0024a5b2:
        Abc_Print(-1,pcVar4);
        goto switchD_0024a485_caseD_4e;
      }
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nMinOutputs = iVar1;
      break;
    case 0x4e:
    case 0x4f:
    case 0x50:
    case 0x51:
    case 0x55:
    case 0x56:
      goto switchD_0024a485_caseD_4e;
    case 0x52:
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-R\" should be followed by an integer.\n";
        goto LAB_0024a5b2;
      }
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nRounds = iVar1;
      break;
    case 0x53:
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-S\" should be followed by an integer.\n";
        goto LAB_0024a5b2;
      }
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nNonRefines = iVar1;
      break;
    case 0x54:
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-T\" should be followed by an integer.\n";
        goto LAB_0024a5b2;
      }
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.TimeLimit = iVar1;
      break;
    case 0x57:
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-W\" should be followed by an integer.\n";
        goto LAB_0024a5b2;
      }
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nWords = iVar1;
      break;
    default:
      if (iVar1 == 0x43) {
        if (argc <= globalUtilOptind) {
          pcVar4 = "Command line switch \"-C\" should be followed by an integer.\n";
          goto LAB_0024a5b2;
        }
        iVar1 = atoi(argv[globalUtilOptind]);
        Pars.nBTLimit = iVar1;
      }
      else {
        if (iVar1 != 0x46) {
          piVar2 = &Pars.fDualOut;
          if ((iVar1 != 100) && (piVar2 = &Pars.fCheckMiter, iVar1 != 0x6d)) {
            if (iVar1 != 0x76) {
              if (iVar1 == -1) {
                if (pAbc->pGia != (Gia_Man_t *)0x0) {
                  Cec_ManSeqSemiformal(pAbc->pGia,&Pars);
                  return 0;
                }
                pcVar4 = "Abc_CommandAbc9Resim(): There is no AIG.\n";
                iVar3 = -1;
                goto LAB_0024a6e1;
              }
              goto switchD_0024a485_caseD_4e;
            }
            piVar2 = &Pars.fVerbose;
          }
          *(byte *)piVar2 = (byte)*piVar2 ^ 1;
          goto LAB_0024a42f;
        }
        if (argc <= globalUtilOptind) {
          pcVar4 = "Command line switch \"-F\" should be followed by an integer.\n";
          goto LAB_0024a5b2;
        }
        iVar1 = atoi(argv[globalUtilOptind]);
        Pars.nFrames = iVar1;
      }
    }
    globalUtilOptind = iVar3 + 1;
    if (iVar1 < 0) {
switchD_0024a485_caseD_4e:
      iVar3 = -2;
      Abc_Print(-2,"usage: &semi [-WRFSMCT num] [-mdvh]\n");
      Abc_Print(-2,"\t         performs semiformal refinement of equivalence classes\n");
      Abc_Print(-2,"\t-W num : the number of words to simulate [default = %d]\n",
                (ulong)(uint)Pars.nWords);
      Abc_Print(-2,"\t-R num : the max number of rounds to simulate [default = %d]\n",
                (ulong)(uint)Pars.nRounds);
      Abc_Print(-2,"\t-F num : the max number of frames to unroll [default = %d]\n",
                (ulong)(uint)Pars.nFrames);
      Abc_Print(-2,"\t-S num : the max number of rounds w/o refinement to stop [default = %d]\n",
                (ulong)(uint)Pars.nNonRefines);
      Abc_Print(-2,"\t-M num : the min number of outputs of bounded SRM [default = %d]\n",
                (ulong)(uint)Pars.nMinOutputs);
      Abc_Print(-2,"\t-C num : the max number of conflicts at a node [default = %d]\n",
                (ulong)(uint)Pars.nBTLimit);
      Abc_Print(-2,"\t-T num : approximate runtime limit in seconds [default = %d]\n",
                (ulong)(uint)Pars.TimeLimit);
      pcVar4 = "miter";
      if (Pars.fCheckMiter == 0) {
        pcVar4 = "circuit";
      }
      Abc_Print(-2,"\t-m     : toggle miter vs. any circuit [default = %s]\n",pcVar4);
      pcVar5 = "yes";
      pcVar4 = "yes";
      if (Pars.fDualOut == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-d     : toggle using two POs intead of XOR [default = %s]\n",pcVar4);
      if (Pars.fVerbose == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar5);
      pcVar4 = "\t-h     : print the command usage\n";
LAB_0024a6e1:
      Abc_Print(iVar3,pcVar4);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Semi( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Cec_ParSmf_t Pars, * pPars = &Pars;
    int c;
    Cec_ManSmfSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "WRFSMCTmdvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nWords = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nWords < 0 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-R\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nRounds = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRounds < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFrames < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nNonRefines = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nNonRefines < 0 )
                goto usage;
            break;
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nMinOutputs = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nMinOutputs < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBTLimit < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimeLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeLimit < 0 )
                goto usage;
            break;
        case 'm':
            pPars->fCheckMiter ^= 1;
            break;
        case 'd':
            pPars->fDualOut ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Resim(): There is no AIG.\n" );
        return 1;
    }
    Cec_ManSeqSemiformal( pAbc->pGia, pPars );
    return 0;

usage:
    Abc_Print( -2, "usage: &semi [-WRFSMCT num] [-mdvh]\n" );
    Abc_Print( -2, "\t         performs semiformal refinement of equivalence classes\n" );
    Abc_Print( -2, "\t-W num : the number of words to simulate [default = %d]\n", pPars->nWords );
    Abc_Print( -2, "\t-R num : the max number of rounds to simulate [default = %d]\n", pPars->nRounds );
    Abc_Print( -2, "\t-F num : the max number of frames to unroll [default = %d]\n", pPars->nFrames );
    Abc_Print( -2, "\t-S num : the max number of rounds w/o refinement to stop [default = %d]\n", pPars->nNonRefines );
    Abc_Print( -2, "\t-M num : the min number of outputs of bounded SRM [default = %d]\n", pPars->nMinOutputs );
    Abc_Print( -2, "\t-C num : the max number of conflicts at a node [default = %d]\n", pPars->nBTLimit );
    Abc_Print( -2, "\t-T num : approximate runtime limit in seconds [default = %d]\n", pPars->TimeLimit );
    Abc_Print( -2, "\t-m     : toggle miter vs. any circuit [default = %s]\n", pPars->fCheckMiter? "miter": "circuit" );
    Abc_Print( -2, "\t-d     : toggle using two POs intead of XOR [default = %s]\n", pPars->fDualOut? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}